

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmapfile.cpp
# Opt level: O0

void __thiscall MemoryMappedFile::MemoryMappedFile(MemoryMappedFile *this,char *path)

{
  int iVar1;
  void *pvVar2;
  void *baseAddress;
  stat fileSt;
  int file;
  char *path_local;
  MemoryMappedFile *this_local;
  
  this->file = 0;
  this->baseAddress = (void *)0x0;
  this->fileSize = 0;
  fileSt.__glibc_reserved[2]._4_4_ = open(path,0);
  if (fileSt.__glibc_reserved[2]._4_4_ != -1) {
    iVar1 = fstat(fileSt.__glibc_reserved[2]._4_4_,(stat *)&baseAddress);
    if (iVar1 == -1) {
      close(fileSt.__glibc_reserved[2]._4_4_);
    }
    else {
      pvVar2 = mmap((void *)0x0,fileSt.st_rdev,1,2,fileSt.__glibc_reserved[2]._4_4_,0);
      if (pvVar2 == (void *)0xffffffffffffffff) {
        close(fileSt.__glibc_reserved[2]._4_4_);
      }
      else {
        this->file = fileSt.__glibc_reserved[2]._4_4_;
        this->baseAddress = pvVar2;
        this->fileSize = fileSt.st_rdev;
      }
    }
  }
  return;
}

Assistant:

MemoryMappedFile::MemoryMappedFile(const char* path)
{
#ifdef _WIN32
	void* file = CreateFileA(path, GENERIC_READ, FILE_SHARE_READ, nullptr, OPEN_EXISTING, FILE_ATTRIBUTE_READONLY, nullptr);
	if (file == INVALID_HANDLE_VALUE)
		return;

	LARGE_INTEGER fileSize = {};
	GetFileSizeEx(file, &fileSize);

	void* fileMapping = CreateFileMappingW(file, nullptr, PAGE_READONLY, 0, 0, nullptr);
	if (fileMapping == nullptr)
	{
		CloseHandle(file);
		return;
	}

	void* baseAddress = MapViewOfFile(fileMapping, FILE_MAP_READ, 0, 0, 0);
	if (baseAddress == nullptr)
	{
		CloseHandle(fileMapping);
		CloseHandle(file);
		return;
	}

	this->file = file;
	this->mapping = fileMapping;
	this->baseAddress = baseAddress;
	this->fileSize = fileSize.QuadPart;
#else
    int file = open(path, O_RDONLY);
    if (file == -1)
        return;
    struct stat fileSt;
    if (fstat(file, &fileSt) == -1)
    {
        close(file);
        return;
    }
    void* baseAddress = mmap(nullptr, fileSt.st_size, PROT_READ, MAP_PRIVATE, file, 0);
    if (baseAddress == MAP_FAILED)
    {
        close(file);
        return;
    }
    this->file = file;
    this->baseAddress = baseAddress;
    this->fileSize = fileSt.st_size;
#endif
}